

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O3

Instr * __thiscall
LowererMDArch::LowerWasmArrayBoundsCheck(LowererMDArch *this,Instr *instr,Opnd *addrOpnd)

{
  Opnd *src1;
  Opnd *compareSrc2;
  Lowerer *pLVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  JITTimeFunctionBody *this_00;
  LabelInstr *target;
  LabelInstr *target_00;
  LabelInstr *pLVar6;
  Int64ConstOpnd *src2;
  Int64ConstOpnd *dst;
  IntConstOpnd *pIVar7;
  
  OVar3 = IR::Opnd::GetKind(addrOpnd);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar4) goto LAB_00645268;
    *puVar5 = 0;
  }
  src1 = *(Opnd **)&addrOpnd[1].m_valueType;
  if ((src1 == (Opnd *)0x0) || ((src1->m_type & ~TyInt64) == TyInt32)) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar4 = JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer(this_00);
    if (!bVar4) {
      if (instr->m_src2 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                           ,0x462,"(instr->GetSrc2())","instr->GetSrc2()");
        if (!bVar4) goto LAB_00645268;
        *puVar5 = 0;
      }
      target = Lowerer::InsertLabel(true,instr);
      target_00 = Lowerer::InsertLabel(false,instr);
      pLVar6 = Lowerer::InsertLabel(false,instr);
      compareSrc2 = instr->m_src2;
      src2 = IR::Int64ConstOpnd::New
                       ((long)TySize[addrOpnd->m_type] + (ulong)*(uint *)&addrOpnd[2]._vptr_Opnd,
                        TyInt64,this->m_func);
      dst = src2;
      if (src1 != (Opnd *)0x0) {
        dst = (Int64ConstOpnd *)IR::RegOpnd::New(TyInt64,this->m_func);
        Lowerer::InsertAdd(true,(Opnd *)dst,src1,&src2->super_Opnd,&target->super_Instr);
      }
      Lowerer::InsertCompareBranch
                (this->lowererMD->m_lowerer,&dst->super_Opnd,compareSrc2,BrGt_A,true,target,
                 &target->super_Instr,false);
      pLVar1 = this->lowererMD->m_lowerer;
      pIVar7 = IR::IntConstOpnd::New(-0x7ff5e497,TyInt32,this->m_func,false);
      Lowerer::GenerateThrow(pLVar1,&pIVar7->super_Opnd,&target_00->super_Instr);
      Lowerer::InsertBranch(Br,target_00,&target->super_Instr);
      instr = &pLVar6->super_Instr;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0x459,"((0))","UNREACHED");
    if (!bVar4) {
LAB_00645268:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    pLVar1 = this->lowererMD->m_lowerer;
    pIVar7 = IR::IntConstOpnd::New(-0x7ff5e497,TyInt32,this->m_func,false);
    Lowerer::GenerateThrow(pLVar1,&pIVar7->super_Opnd,instr);
  }
  return &((LabelInstr *)instr)->super_Instr;
}

Assistant:

IR::Instr *
LowererMDArch::LowerWasmArrayBoundsCheck(IR::Instr * instr, IR::Opnd *addrOpnd)
{
    IR::IndirOpnd * indirOpnd = addrOpnd->AsIndirOpnd();
    IR::RegOpnd * indexOpnd = indirOpnd->GetIndexOpnd();
    if (indexOpnd && !indexOpnd->IsIntegral32())
    {
        // We don't expect the index to be anything other than an int32 or uint32
        // Having an int32 index guaranties that int64 index add doesn't overflow
        // If we're wrong, just throw index out of range
        Assert(UNREACHED);
        lowererMD->m_lowerer->GenerateThrow(IR::IntConstOpnd::New(WASMERR_ArrayIndexOutOfRange, TyInt32, m_func), instr);
        return instr;
    }
    if (m_func->GetJITFunctionBody()->UsesWAsmJsFastVirtualBuffer())
    {
        return instr;
    }

    Assert(instr->GetSrc2());
    IR::LabelInstr * helperLabel = Lowerer::InsertLabel(true, instr);
    IR::LabelInstr * loadLabel = Lowerer::InsertLabel(false, instr);
    IR::LabelInstr * doneLabel = Lowerer::InsertLabel(false, instr);

    // Find array buffer length
    uint32 offset = indirOpnd->GetOffset();
    IR::Opnd *arrayLenOpnd = instr->GetSrc2();
    IR::Int64ConstOpnd * constOffsetOpnd = IR::Int64ConstOpnd::New((int64)addrOpnd->GetSize() + (int64)offset, TyInt64, m_func);
    IR::Opnd *cmpOpnd;
    if (indexOpnd != nullptr)
    {
        // Compare index + memop access length and array buffer length, and generate RuntimeError if greater
        cmpOpnd = IR::RegOpnd::New(TyInt64, m_func);
        Lowerer::InsertAdd(true, cmpOpnd, indexOpnd, constOffsetOpnd, helperLabel);
    }
    else
    {
        cmpOpnd = constOffsetOpnd;
    }
    lowererMD->m_lowerer->InsertCompareBranch(cmpOpnd, arrayLenOpnd, Js::OpCode::BrGt_A, true, helperLabel, helperLabel);
    lowererMD->m_lowerer->GenerateThrow(IR::IntConstOpnd::New(WASMERR_ArrayIndexOutOfRange, TyInt32, m_func), loadLabel);
    Lowerer::InsertBranch(Js::OpCode::Br, loadLabel, helperLabel);
    return doneLabel;
}